

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.cpp
# Opt level: O1

void __thiscall
aeron::Publication::Publication
          (Publication *this,ClientConductor *conductor,string *channel,int64_t registrationId,
          int64_t originalRegistrationId,int32_t streamId,int32_t sessionId,
          UnsafeBufferPosition *publicationLimit,int32_t channelStatusId,
          shared_ptr<aeron::LogBuffers> *logBuffers)

{
  uint uVar1;
  pointer pcVar2;
  element_type *peVar3;
  uint8_t *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  void *pvVar6;
  int32_t iVar7;
  long lVar8;
  long *plVar9;
  int iVar10;
  long lVar12;
  uint uVar11;
  
  this->_vptr_Publication = (_func_int **)&PTR__Publication_00163c58;
  this->m_conductor = conductor;
  this->m_logMetaDataBuffer =
       ((logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_buffers + 3;
  (this->m_channel)._M_dataplus._M_p = (pointer)&(this->m_channel).field_2;
  pcVar2 = (channel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_channel,pcVar2,pcVar2 + channel->_M_string_length);
  this->m_registrationId = registrationId;
  this->m_originalRegistrationId = originalRegistrationId;
  peVar3 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = peVar3->m_buffers[0].m_length;
  this->m_maxPossiblePosition = (long)(int)uVar1 << 0x1f;
  this->m_streamId = streamId;
  this->m_sessionId = sessionId;
  puVar4 = this->m_logMetaDataBuffer->m_buffer;
  this->m_initialTermId = *(int32_t *)(puVar4 + 0x108);
  this->m_maxPayloadLength = *(int *)(puVar4 + 0x110) + -0x20;
  uVar11 = uVar1 + 7;
  if (-1 < (long)(int)uVar1) {
    uVar11 = uVar1;
  }
  iVar10 = (int)uVar11 >> 3;
  if (0xffffff < iVar10) {
    iVar10 = 0x1000000;
  }
  this->m_maxMessageLength = iVar10;
  iVar10 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
    }
  }
  this->m_positionBitsToShift = iVar10;
  (this->m_publicationLimit).m_impl.m_buffer._vptr_AtomicBuffer =
       (_func_int **)&PTR__AtomicBuffer_001631c8;
  (this->m_publicationLimit).m_impl.m_buffer.m_buffer = (uint8_t *)0x0;
  (this->m_publicationLimit).m_impl.m_buffer.m_length = 0;
  (this->m_publicationLimit).m_impl.m_buffer.m_buffer = (publicationLimit->m_buffer).m_buffer;
  (this->m_publicationLimit).m_impl.m_buffer.m_length = (publicationLimit->m_buffer).m_length;
  iVar7 = publicationLimit->m_offset;
  (this->m_publicationLimit).m_impl.m_id = publicationLimit->m_id;
  (this->m_publicationLimit).m_impl.m_offset = iVar7;
  this->m_channelStatusId = channelStatusId;
  (this->m_isClosed)._M_base._M_i = false;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  p_Var5 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  lVar8 = 0xa0;
  do {
    *(undefined8 *)((long)&this->_vptr_Publication + lVar8) = 0;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0xb8);
  puVar4 = this->m_logMetaDataBuffer->m_buffer;
  (this->m_headerWriter).m_sessionId = *(int32_t *)(puVar4 + 0x14c);
  (this->m_headerWriter).m_streamId = *(int32_t *)(puVar4 + 0x150);
  lVar12 = 0x18;
  lVar8 = 0;
  do {
    plVar9 = (long *)operator_new(0x18);
    peVar3 = (logBuffers->super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *plVar9 = (long)&((element_type *)(peVar3->m_buffers + -1))->_vptr_LogBuffers + lVar12;
    plVar9[1] = (long)(peVar3->m_buffers + 3);
    *(int *)(plVar9 + 2) = (int)lVar8;
    pvVar6 = *(void **)((long)&this->m_appenders[0]._M_t.
                               super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                               .
                               super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>
                               ._M_head_impl + lVar8);
    *(long **)((long)&this->m_appenders[0]._M_t.
                      super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                      .super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>.
                      _M_head_impl + lVar8) = plVar9;
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6);
    }
    lVar8 = lVar8 + 8;
    lVar12 = lVar12 + 0x18;
  } while (lVar8 != 0x18);
  return;
}

Assistant:

Publication::Publication(
    ClientConductor &conductor,
    const std::string &channel,
    std::int64_t registrationId,
    std::int64_t originalRegistrationId,
    std::int32_t streamId,
    std::int32_t sessionId,
    UnsafeBufferPosition& publicationLimit,
    std::int32_t channelStatusId,
    std::shared_ptr<LogBuffers> logBuffers)
    :
    m_conductor(conductor),
    m_logMetaDataBuffer(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
    m_channel(channel),
    m_registrationId(registrationId),
    m_originalRegistrationId(originalRegistrationId),
    m_maxPossiblePosition(static_cast<int64_t>(logBuffers->atomicBuffer(0).capacity()) << 31),
    m_streamId(streamId),
    m_sessionId(sessionId),
    m_initialTermId(LogBufferDescriptor::initialTermId(m_logMetaDataBuffer)),
    m_maxPayloadLength(LogBufferDescriptor::mtuLength(m_logMetaDataBuffer) - DataFrameHeader::LENGTH),
    m_maxMessageLength(FrameDescriptor::computeMaxMessageLength(logBuffers->atomicBuffer(0).capacity())),
    m_positionBitsToShift(util::BitUtil::numberOfTrailingZeroes(logBuffers->atomicBuffer(0).capacity())),
    m_publicationLimit(publicationLimit),
    m_channelStatusId(channelStatusId),
    m_logBuffers(logBuffers),
    m_headerWriter(LogBufferDescriptor::defaultFrameHeader(m_logMetaDataBuffer))
{
    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        /*
         * TODO:
         * perhaps allow copy-construction and be able to move appenders and AtomicBuffers directly into Publication for
         * locality.
         */
        m_appenders[i] = std::unique_ptr<TermAppender>(new TermAppender(
            logBuffers->atomicBuffer(i),
            logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX),
            i));
    }
}